

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O3

void __thiscall CriticalSectionsBuilder::preVisit(CriticalSectionsBuilder *this,Node *node)

{
  NodeType NVar1;
  pair<std::_Rb_tree_iterator<UnlockNode_*>,_std::_Rb_tree_iterator<UnlockNode_*>_> pVar2;
  type *unlockNode;
  Node *local_20;
  Node *local_18;
  
  local_18 = node;
  std::_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>::
  _M_insert_unique<Node*const&>
            ((_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>> *)
             &this->visited_,&local_18);
  local_20 = local_18;
  if (local_18 != (Node *)0x0) {
    NVar1 = Node::getType(local_18);
    if (NVar1 == UNLOCK) {
      pVar2 = std::
              _Rb_tree<UnlockNode_*,_UnlockNode_*,_std::_Identity<UnlockNode_*>,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>
              ::equal_range(&(this->currentUnlocks)._M_t,(key_type *)&local_20);
      std::
      _Rb_tree<UnlockNode_*,_UnlockNode_*,_std::_Identity<UnlockNode_*>,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>
      ::_M_erase_aux(&(this->currentUnlocks)._M_t,(_Base_ptr)pVar2.first._M_node,
                     (_Base_ptr)pVar2.second._M_node);
    }
  }
  return;
}

Assistant:

void CriticalSectionsBuilder::preVisit(Node *node) {
    visited_.insert(node);
    if (auto *unlockNode = castNode<NodeType::UNLOCK>(node)) {
        currentUnlocks.erase(unlockNode);
    }
}